

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  FileMetaData **ppFVar1;
  FileMetaData *pFVar2;
  FileMetaData *pFVar3;
  FileMetaData **ppFVar4;
  Comparator *pCVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  pointer ppFVar9;
  ulong uVar10;
  FileMetaData **ppFVar11;
  FileMetaData **ppFVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  size_t __n;
  pointer ppFVar17;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  FileMetaData **ppFVar18;
  value_type __val_2;
  pointer ppFVar19;
  value_type __val;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_b8;
  FileMetaData *local_98;
  FileMetaData **local_90;
  void *local_88;
  Comparator *local_80;
  Slice local_78;
  Version *local_68;
  char *local_60;
  size_t local_58;
  Slice local_50;
  Slice local_40;
  
  local_40.size_ = internal_key.size_;
  local_40.data_ = internal_key.data_;
  local_58 = user_key.size_;
  local_60 = user_key.data_;
  local_80 = (this->vset_->icmp_).user_comparator_;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
  local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
  local_88 = arg;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            (&local_b8,
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pCVar5 = local_80;
  ppFVar9 = this->files_[0].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->files_[0].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar9) {
    uVar10 = 0;
    uVar14 = 1;
    do {
      local_98 = ppFVar9[uVar10];
      local_78 = InternalKey::user_key(&local_98->smallest);
      iVar7 = (*pCVar5->_vptr_Comparator[2])(pCVar5,&local_60,&local_78);
      if (-1 < iVar7) {
        local_50 = InternalKey::user_key(&local_98->largest);
        iVar7 = (*pCVar5->_vptr_Comparator[2])(pCVar5,&local_60,&local_50);
        if (iVar7 < 1) {
          if (local_b8.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
            _M_realloc_insert<leveldb::FileMetaData*const&>
                      ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_98);
          }
          else {
            *local_b8.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_98;
            local_b8.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      ppFVar9 = this->files_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)this->files_[0].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3
                              );
      uVar10 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppFVar17 = local_b8.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppFVar9 = local_b8.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar13 = (long)local_b8.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = lVar13 >> 3;
    lVar15 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
              ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_b8.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)0x117f30
              );
    ppFVar18 = ppFVar9 + 1;
    local_90 = ppFVar17;
    if (lVar13 < 0x81) {
      ppFVar12 = ppFVar9;
      if (ppFVar18 != ppFVar17) {
        do {
          pFVar2 = *ppFVar18;
          uVar10 = pFVar2->number;
          if ((*ppFVar9)->number < uVar10) {
            memmove((void *)((long)ppFVar12 + (0x10 - ((long)ppFVar18 - (long)ppFVar9))),ppFVar9,
                    (long)ppFVar18 - (long)ppFVar9);
            ppFVar12 = ppFVar9;
            ppFVar17 = local_90;
          }
          else {
            pFVar3 = *ppFVar12;
            uVar14 = pFVar3->number;
            ppFVar12 = ppFVar18;
            while (uVar14 < uVar10) {
              *ppFVar12 = pFVar3;
              pFVar3 = ppFVar12[-2];
              ppFVar12 = ppFVar12 + -1;
              uVar14 = pFVar3->number;
            }
          }
          *ppFVar12 = pFVar2;
          ppFVar1 = ppFVar18 + 1;
          ppFVar12 = ppFVar18;
          ppFVar18 = ppFVar1;
        } while (ppFVar1 != ppFVar17);
      }
    }
    else {
      __n = 8;
      ppFVar12 = ppFVar18;
      ppFVar19 = ppFVar9;
      local_68 = this;
      do {
        ppFVar1 = (FileMetaData **)((long)ppFVar9 + __n);
        pFVar2 = *(FileMetaData **)((long)ppFVar9 + __n);
        uVar10 = pFVar2->number;
        if ((*ppFVar9)->number < uVar10) {
          memmove(ppFVar18,ppFVar9,__n);
          ppFVar11 = ppFVar9;
          ppFVar17 = local_90;
        }
        else {
          pFVar3 = *ppFVar19;
          uVar14 = pFVar3->number;
          ppFVar11 = ppFVar1;
          ppFVar4 = ppFVar12;
          while (uVar14 < uVar10) {
            *ppFVar4 = pFVar3;
            pFVar3 = ppFVar4[-2];
            ppFVar11 = ppFVar4 + -1;
            ppFVar4 = ppFVar11;
            uVar14 = pFVar3->number;
          }
        }
        *ppFVar11 = pFVar2;
        __n = __n + 8;
        ppFVar12 = ppFVar12 + 1;
        ppFVar19 = ppFVar1;
      } while (__n != 0x80);
      for (ppFVar18 = ppFVar9 + 0x10; this = local_68, ppFVar18 != ppFVar17; ppFVar18 = ppFVar18 + 1
          ) {
        pFVar2 = ppFVar18[-1];
        pFVar3 = *ppFVar18;
        uVar10 = pFVar3->number;
        uVar14 = pFVar2->number;
        ppFVar12 = ppFVar18;
        while (uVar14 < uVar10) {
          *ppFVar12 = pFVar2;
          pFVar2 = ppFVar12[-2];
          ppFVar12 = ppFVar12 + -1;
          uVar14 = pFVar2->number;
        }
        *ppFVar12 = pFVar3;
      }
    }
    if (local_b8.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      uVar14 = 1;
      do {
        bVar6 = (*func)(local_88,0,
                        local_b8.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]);
        if (!bVar6) goto LAB_00117f10;
        bVar6 = uVar14 < (ulong)((long)local_b8.
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar10 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar6);
    }
  }
  files = this->files_;
  uVar16 = 1;
  do {
    files = files + 1;
    lVar15 = (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
    if (lVar15 != 0) {
      uVar8 = FindFile(&this->vset_->icmp_,files,&local_40);
      if ((ulong)uVar8 < (ulong)(lVar15 >> 3)) {
        pFVar2 = (files->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar8];
        local_78 = InternalKey::user_key(&pFVar2->smallest);
        iVar7 = (*local_80->_vptr_Comparator[2])(local_80,&local_60,&local_78);
        if ((-1 < iVar7) && (bVar6 = (*func)(local_88,uVar16,pFVar2), !bVar6)) {
LAB_00117f10:
          if (local_b8.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (FileMetaData **)0x0) {
            operator_delete(local_b8.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
      }
    }
    if (5 < uVar16) goto LAB_00117f10;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}